

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

bool __thiscall
ImPlot::
ShadedRenderer<ImPlot::GetterXsYs<double>,_ImPlot::GetterXsYRef<double>,_ImPlot::TransformerLogLog>
::operator()(ShadedRenderer<ImPlot::GetterXsYs<double>,_ImPlot::GetterXsYRef<double>,_ImPlot::TransformerLogLog>
             *this,ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  int iVar11;
  GetterXsYs<double> *pGVar12;
  TransformerLogLog *pTVar13;
  ImPlotPlot *pIVar14;
  GetterXsYRef<double> *pGVar15;
  ImDrawVert *pIVar16;
  ImDrawIdx *pIVar17;
  double dVar18;
  double dVar19;
  ImVec2 IVar20;
  ushort uVar21;
  ImPlotContext *pIVar22;
  ImPlotContext *pIVar23;
  bool bVar24;
  long lVar25;
  ImDrawIdx IVar26;
  uint uVar27;
  float fVar28;
  float fVar29;
  ImVec2 IVar30;
  float fVar31;
  ImVec2 IVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  
  pIVar22 = GImPlot;
  pGVar12 = this->Getter1;
  pTVar13 = this->Transformer;
  iVar11 = pGVar12->Count;
  lVar25 = (long)(((pGVar12->Offset + prim + 1) % iVar11 + iVar11) % iVar11) * (long)pGVar12->Stride
  ;
  dVar7 = *(double *)((long)pGVar12->Ys + lVar25);
  dVar18 = log10(*(double *)((long)pGVar12->Xs + lVar25) / (GImPlot->CurrentPlot->XAxis).Range.Min);
  dVar8 = pIVar22->LogDenX;
  pIVar14 = pIVar22->CurrentPlot;
  dVar9 = (pIVar14->XAxis).Range.Min;
  dVar10 = (pIVar14->XAxis).Range.Max;
  dVar19 = log10(dVar7 / pIVar14->YAxis[pTVar13->YAxis].Range.Min);
  pIVar23 = GImPlot;
  iVar11 = pTVar13->YAxis;
  pIVar14 = pIVar22->CurrentPlot;
  dVar7 = pIVar14->YAxis[iVar11].Range.Min;
  fVar29 = (float)((((double)(float)(dVar18 / dVar8) * (dVar10 - dVar9) + dVar9) -
                   (pIVar14->XAxis).Range.Min) * pIVar22->Mx +
                  (double)pIVar22->PixelRange[iVar11].Min.x);
  fVar28 = (float)((((double)(float)(dVar19 / pIVar22->LogDenY[iVar11]) *
                     (pIVar14->YAxis[iVar11].Range.Max - dVar7) + dVar7) - dVar7) *
                   pIVar22->My[iVar11] + (double)pIVar22->PixelRange[iVar11].Min.y);
  pGVar15 = this->Getter2;
  pTVar13 = this->Transformer;
  iVar11 = pGVar15->Count;
  dVar7 = pGVar15->YRef;
  dVar18 = log10(*(double *)
                  ((long)pGVar15->Xs +
                  (long)(((prim + 1 + pGVar15->Offset) % iVar11 + iVar11) % iVar11) *
                  (long)pGVar15->Stride) / (GImPlot->CurrentPlot->XAxis).Range.Min);
  dVar8 = pIVar23->LogDenX;
  pIVar14 = pIVar23->CurrentPlot;
  dVar9 = (pIVar14->XAxis).Range.Min;
  dVar10 = (pIVar14->XAxis).Range.Max;
  dVar19 = log10(dVar7 / pIVar14->YAxis[pTVar13->YAxis].Range.Min);
  iVar11 = pTVar13->YAxis;
  pIVar14 = pIVar23->CurrentPlot;
  dVar7 = pIVar14->YAxis[iVar11].Range.Min;
  fVar33 = (float)((((double)(float)(dVar18 / dVar8) * (dVar10 - dVar9) + dVar9) -
                   (pIVar14->XAxis).Range.Min) * pIVar23->Mx +
                  (double)pIVar23->PixelRange[iVar11].Min.x);
  fVar35 = (float)((((double)(float)(dVar19 / pIVar23->LogDenY[iVar11]) *
                     (pIVar14->YAxis[iVar11].Range.Max - dVar7) + dVar7) - dVar7) *
                   pIVar23->My[iVar11] + (double)pIVar23->PixelRange[iVar11].Min.y);
  fVar2 = (this->P11).x;
  fVar3 = (this->P11).y;
  fVar4 = (this->P12).x;
  fVar5 = (this->P12).y;
  fVar31 = fVar3;
  if (fVar5 <= fVar3) {
    fVar31 = fVar5;
  }
  if (fVar28 <= fVar31) {
    fVar31 = fVar28;
  }
  if (fVar35 <= fVar31) {
    fVar31 = fVar35;
  }
  bVar24 = false;
  if ((fVar31 < (cull_rect->Max).y) &&
     (fVar31 = (float)(~-(uint)(fVar5 <= fVar3) & (uint)fVar5 |
                      -(uint)(fVar5 <= fVar3) & (uint)fVar3), uVar27 = -(uint)(fVar28 <= fVar31),
     fVar31 = (float)(~uVar27 & (uint)fVar28 | uVar27 & (uint)fVar31),
     uVar27 = -(uint)(fVar35 <= fVar31),
     fVar31 = (float)(~uVar27 & (uint)fVar35 | uVar27 & (uint)fVar31), pfVar1 = &(cull_rect->Min).y,
     *pfVar1 <= fVar31 && fVar31 != *pfVar1)) {
    fVar31 = fVar2;
    if (fVar4 <= fVar2) {
      fVar31 = fVar4;
    }
    if (fVar29 <= fVar31) {
      fVar31 = fVar29;
    }
    if (fVar33 <= fVar31) {
      fVar31 = fVar33;
    }
    bVar24 = false;
    if (fVar31 < (cull_rect->Max).x) {
      fVar31 = (float)(~-(uint)(fVar4 <= fVar2) & (uint)fVar4 |
                      -(uint)(fVar4 <= fVar2) & (uint)fVar2);
      uVar27 = -(uint)(fVar29 <= fVar31);
      fVar31 = (float)(~uVar27 & (uint)fVar29 | uVar27 & (uint)fVar31);
      uVar27 = -(uint)(fVar33 <= fVar31);
      fVar31 = (float)(~uVar27 & (uint)fVar33 | uVar27 & (uint)fVar31);
      bVar24 = (cull_rect->Min).x <= fVar31 && fVar31 != (cull_rect->Min).x;
    }
  }
  IVar30.y = fVar28;
  IVar30.x = fVar29;
  IVar32.y = fVar35;
  IVar32.x = fVar33;
  if (bVar24 != false) {
    fVar31 = (this->P11).y;
    fVar6 = (this->P12).y;
    fVar37 = fVar2 * fVar28 - fVar29 * fVar3;
    fVar36 = fVar4 * fVar35 - fVar33 * fVar5;
    fVar34 = (fVar2 - fVar29) * (fVar5 - fVar35) - (fVar4 - fVar33) * (fVar3 - fVar28);
    DrawList->_VtxWritePtr->pos = this->P11;
    DrawList->_VtxWritePtr->uv = *uv;
    pIVar16 = DrawList->_VtxWritePtr;
    pIVar16->col = this->Col;
    pIVar16[1].pos = IVar30;
    DrawList->_VtxWritePtr[1].uv = *uv;
    pIVar16 = DrawList->_VtxWritePtr;
    pIVar16[1].col = this->Col;
    IVar20.y = ((fVar5 - fVar35) * fVar37 - (fVar3 - fVar28) * fVar36) / fVar34;
    IVar20.x = (fVar37 * (fVar4 - fVar33) - (fVar2 - fVar29) * fVar36) / fVar34;
    pIVar16[2].pos = IVar20;
    DrawList->_VtxWritePtr[2].uv = *uv;
    pIVar16 = DrawList->_VtxWritePtr;
    pIVar16[2].col = this->Col;
    pIVar16[3].pos = this->P12;
    DrawList->_VtxWritePtr[3].uv = *uv;
    pIVar16 = DrawList->_VtxWritePtr;
    pIVar16[3].col = this->Col;
    pIVar16[4].pos = IVar32;
    DrawList->_VtxWritePtr[4].uv = *uv;
    pIVar16 = DrawList->_VtxWritePtr;
    pIVar16[4].col = this->Col;
    DrawList->_VtxWritePtr = pIVar16 + 5;
    uVar27 = DrawList->_VtxCurrentIdx;
    pIVar17 = DrawList->_IdxWritePtr;
    IVar26 = (ImDrawIdx)uVar27;
    *pIVar17 = IVar26;
    uVar21 = -(ushort)(fVar6 < fVar31 && fVar28 < fVar35 || fVar31 < fVar6 && fVar35 < fVar28) & 1;
    pIVar17[1] = IVar26 + uVar21 + 1;
    pIVar17[2] = IVar26 + 3;
    pIVar17[3] = IVar26 + 1;
    pIVar17[4] = (uVar21 ^ 3) + IVar26;
    pIVar17[5] = IVar26 + 4;
    DrawList->_IdxWritePtr = pIVar17 + 6;
    DrawList->_VtxCurrentIdx = uVar27 + 5;
  }
  this->P11 = IVar30;
  this->P12 = IVar32;
  return bVar24;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P21 = Transformer(Getter1(prim+1));
        ImVec2 P22 = Transformer(Getter2(prim+1));
        ImRect rect(ImMin(ImMin(ImMin(P11,P12),P21),P22), ImMax(ImMax(ImMax(P11,P12),P21),P22));
        if (!cull_rect.Overlaps(rect)) {
            P11 = P21;
            P12 = P22;
            return false;
        }
        const int intersect = (P11.y > P12.y && P22.y > P21.y) || (P12.y > P11.y && P21.y > P22.y);
        ImVec2 intersection = Intersection(P11,P21,P12,P22);
        DrawList._VtxWritePtr[0].pos = P11;
        DrawList._VtxWritePtr[0].uv  = uv;
        DrawList._VtxWritePtr[0].col = Col;
        DrawList._VtxWritePtr[1].pos = P21;
        DrawList._VtxWritePtr[1].uv  = uv;
        DrawList._VtxWritePtr[1].col = Col;
        DrawList._VtxWritePtr[2].pos = intersection;
        DrawList._VtxWritePtr[2].uv  = uv;
        DrawList._VtxWritePtr[2].col = Col;
        DrawList._VtxWritePtr[3].pos = P12;
        DrawList._VtxWritePtr[3].uv  = uv;
        DrawList._VtxWritePtr[3].col = Col;
        DrawList._VtxWritePtr[4].pos = P22;
        DrawList._VtxWritePtr[4].uv  = uv;
        DrawList._VtxWritePtr[4].col = Col;
        DrawList._VtxWritePtr += 5;
        DrawList._IdxWritePtr[0] = (ImDrawIdx)(DrawList._VtxCurrentIdx);
        DrawList._IdxWritePtr[1] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1 + intersect);
        DrawList._IdxWritePtr[2] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3);
        DrawList._IdxWritePtr[3] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1);
        DrawList._IdxWritePtr[4] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3 - intersect);
        DrawList._IdxWritePtr[5] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 4);
        DrawList._IdxWritePtr += 6;
        DrawList._VtxCurrentIdx += 5;
        P11 = P21;
        P12 = P22;
        return true;
    }